

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double cauchy_pdf(double x,double a,double b)

{
  double dVar1;
  
  dVar1 = (x - a) / b;
  return 1.0 / ((dVar1 * dVar1 + 1.0) * b * 3.141592653589793);
}

Assistant:

double cauchy_pdf ( double x, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    CAUCHY_PDF evaluates the Cauchy PDF.
//
//  Discussion:
//
//    PDF(A,B;X) = 1 / ( PI * B * ( 1 + ( ( X - A ) / B )^2 ) )
//
//    The Cauchy PDF is also known as the Breit-Wigner PDF.  It
//    has some unusual properties.  In particular, the integrals for the
//    expected value and higher order moments are "singular", in the
//    sense that the limiting values do not exist.  A result can be
//    obtained if the upper and lower limits of integration are set
//    equal to +T and -T, and the limit as T=>INFINITY is taken, but
//    this is a very weak and unreliable sort of limit.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    12 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < B.
//
//    Output, double PDF, the value of the PDF.
//
{
  double pdf;
  const double r8_pi = 3.14159265358979323;
  double y;

  y = ( x - a ) / b;

  pdf = 1.0 / ( r8_pi * b * ( 1.0 + y * y ) );

  return pdf;
}